

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int map_item_compare(void *lhs,void *rhs)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong __n;
  
  uVar1 = *(ulong *)((long)lhs + 8);
  uVar2 = *(ulong *)((long)rhs + 8);
  __n = uVar2;
  if (uVar1 < uVar2) {
    __n = uVar1;
  }
  uVar3 = memcmp(*lhs,*rhs,__n);
  if (uVar3 == 0) {
    uVar3 = -(uint)(uVar1 < uVar2) | 1;
  }
  return uVar3;
}

Assistant:

static int map_item_compare(const void *lhs, const void *rhs)
{
    const struct wally_map_item *l = lhs, *r = rhs;
    const size_t min_len = l->key_len < r->key_len ? l->key_len : r->key_len;
    int cmp;

    cmp = memcmp(l->key, r->key, min_len);
    if (cmp == 0) {
        /* Equal up to the min length, longest key is greater. If we have
         * duplicate keys somehow, the resulting order is undefined */
        cmp = l->key_len < r->key_len ? -1 : 1;
    }
    return cmp;
}